

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::OP_Memset
               (Var instance,int32 start,Var value,int32 length,ScriptContext *scriptContext)

{
  DisableImplicitFlags DVar1;
  ImplicitCallFlags IVar2;
  uint uVar3;
  code *pcVar4;
  int iVar5;
  anon_class_24_3_7ffb91a5 fn;
  anon_class_24_3_7ffb91a5 fn_00;
  anon_class_24_3_7ffb91a5 fn_01;
  anon_class_24_3_7ffb91a5 fn_02;
  anon_class_24_3_7ffb91a5 fn_03;
  anon_class_24_3_7ffb91a5 fn_04;
  anon_class_24_3_7ffb91a5 fn_05;
  anon_class_24_3_7ffb91a5 fn_06;
  uint6 uVar6;
  bool bVar7;
  uint8 uVar8;
  ImplicitCallFlags IVar9;
  bool bVar10;
  BOOL BVar11;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  RecyclableObject *this;
  JavascriptArray *pJVar15;
  TypedArray<float,_false,_false> *this_00;
  TypedArray<unsigned_char,_true,_false> *obj;
  TypedArray<double,_false,_false> *this_01;
  TypedArray<short,_false,_false> *obj_00;
  TypedArray<unsigned_short,_false,_false> *obj_01;
  TypedArray<unsigned_char,_false,_false> *obj_02;
  TypedArray<unsigned_int,_false,_false> *this_02;
  TypedArray<int,_false,_false> *this_03;
  undefined4 in_register_0000000c;
  uint uVar16;
  size_t __n;
  uint32 startIndex;
  Var index;
  Var pvVar17;
  Type puVar18;
  uint32 length_00;
  ulong uVar19;
  ThreadContext *pTVar20;
  Type TVar21;
  Var local_90;
  ScriptContext *local_88;
  undefined8 *local_80;
  undefined8 uStack_78;
  int32 intValue;
  ScriptContext **local_68;
  undefined8 local_60;
  TypedArrayType_conflict5 typedValue;
  Var local_50;
  ulong local_48;
  bool local_39;
  long *local_38;
  
  local_48 = CONCAT44(in_register_0000000c,length);
  pTVar20 = scriptContext->threadContext;
  local_39 = pTVar20->noJsReentrancy;
  pTVar20->noJsReentrancy = true;
  if (length < 1) {
LAB_00abf8bb:
    uVar13 = 0;
    _typedValue = pTVar20;
    goto LAB_00abf8be;
  }
  pvVar17 = (Var)(ulong)(uint)start;
  _typedValue = pTVar20;
  local_50 = value;
  local_38 = (long *)instance;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar7) goto LAB_00abf8f6;
    *puVar14 = 0;
  }
  uVar19 = (ulong)local_38 & 0xffff000000000000;
  if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 && uVar19 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar7) goto LAB_00abf8f6;
    *puVar14 = 0;
  }
  TVar21 = TypeIds_FirstNumberType;
  if ((uVar19 != 0x1000000000000) && (TVar21 = TypeIds_Number, (ulong)local_38 >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(local_38);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar7) goto LAB_00abf8f6;
      *puVar14 = 0;
    }
    TVar21 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar21) && (BVar11 = RecyclableObject::IsExternal(this), BVar11 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar7) goto LAB_00abf8f6;
      *puVar14 = 0;
    }
  }
  pTVar20 = _typedValue;
  uVar12 = local_60._4_4_;
  uVar6 = local_60._2_6_;
  local_88 = scriptContext;
  switch(TVar21) {
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_ArrayLast:
    if (start < 0) {
      index = (Var)((long)pvVar17 + 0x1000000000000);
      do {
        BVar11 = OP_SetElementI(local_38,index,local_50,scriptContext,PropertyOperation_None);
        if (BVar11 == 0) goto LAB_00abf8bb;
        iVar5 = (int)local_48;
        length_00 = iVar5 - 1;
        pvVar17 = (Var)((long)index + 1);
      } while (((int)index < -1) && (index = pvVar17, local_48 = (ulong)length_00, 1 < iVar5));
    }
    else {
      length_00 = (uint32)local_48;
    }
    bVar7 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                      (&scriptContext->optimizationOverrides);
    uVar12 = 0;
    if (bVar7) {
      local_48 = *local_38;
      startIndex = (uint32)pvVar17;
      if (TVar21 == TypeIds_NativeIntArray) {
        bVar10 = TaggedInt::Is(local_50);
        bVar7 = false;
        uVar12 = 0;
        if (bVar10) {
          uStack_78 = (undefined8 **)((ulong)uStack_78._4_4_ << 0x20);
          bVar10 = MemsetConversion<int,_&Js::JavascriptConversion::ToInt32>
                             (local_50,scriptContext,(int *)&uStack_78);
          uVar12 = 0;
          bVar7 = bVar10 && (int)uStack_78 != -0x7fffe;
          if (bVar10 && (int)uStack_78 != -0x7fffe) {
            pJVar15 = UnsafeVarTo<Js::JavascriptArray>(local_38);
            bVar10 = JavascriptArray::DirectSetItemAtRange<int>
                               (pJVar15,startIndex,length_00,(int)uStack_78);
            goto LAB_00abf88b;
          }
          goto LAB_00abf88e;
        }
      }
      else {
        if (TVar21 == TypeIds_Array) {
          pJVar15 = UnsafeVarTo<Js::JavascriptArray>(local_38);
          bVar7 = JavascriptArray::DirectSetItemAtRange<void*>
                            (pJVar15,startIndex,length_00,local_50);
          uVar12 = (uint)bVar7;
          _typedValue = pTVar20;
        }
        else {
          if ((ulong)local_50 >> 0x32 == 0) {
            bVar10 = VarIs<Js::RecyclableObject>(local_50);
            bVar7 = false;
            uVar12 = 0;
            if (bVar10) goto LAB_00abf8b3;
          }
          uStack_78 = (undefined8 **)0x0;
          bVar10 = MemsetConversion<double,_&Js::JavascriptConversion::ToNumber>
                             (local_50,scriptContext,(double *)&uStack_78);
          uVar12 = 0;
          bVar7 = bVar10 && uStack_78 != (undefined8 **)&DAT_fff80002fff80002;
          if (bVar10 && uStack_78 != (undefined8 **)&DAT_fff80002fff80002) {
            pJVar15 = UnsafeVarTo<Js::JavascriptArray>(local_38);
            bVar10 = JavascriptArray::DirectSetItemAtRange<double>
                               (pJVar15,startIndex,length_00,(double)uStack_78);
LAB_00abf88b:
            uVar12 = (uint)bVar10;
          }
LAB_00abf88e:
          if (!bVar7) {
            bVar7 = false;
            pTVar20 = _typedValue;
            goto LAB_00abf8b3;
          }
        }
        uVar12 = uVar12 & local_48 == *local_38;
        bVar7 = true;
        pTVar20 = _typedValue;
      }
LAB_00abf8b3:
      if (!bVar7) goto LAB_00abf8bb;
    }
    goto LAB_00abf75b;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x14aa,"(false)","We don\'t support this type for memset yet.");
    if (!bVar7) {
LAB_00abf8f6:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar14 = 0;
    uVar12 = 0;
    goto LAB_00abf75b;
  case TypeIds_Int8Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)local_60._1_7_ << 8);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_03.value = _intValue;
    fn_03.result = (char **)uStack_78;
    fn_03.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_03);
    uVar12 = 0;
    if (IVar9 < 2) {
      obj_02 = (TypedArray<unsigned_char,_false,_false> *)
               VarTo<Js::TypedArray<char,false,false>>(local_38);
      local_38 = (long *)CONCAT71(local_38._1_7_,(undefined1)local_60);
      BVar11 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<char,false,false>>
                         ((TypedArray<char,_false,_false> *)obj_02);
      uVar12 = 0;
      if (BVar11 == 0) {
        if (((((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).
             super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true) {
          JavascriptError::ThrowTypeError
                    ((((((((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).
                         super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
        }
        if (start < 0) {
          if (-1 < (long)((long)start + (local_48 & 0xffffffff))) {
            local_48 = (ulong)(uint)((int)local_48 + start);
            start = 0;
            goto LAB_00abf53d;
          }
LAB_00abf8ec:
          uVar12 = 1;
        }
        else {
LAB_00abf53d:
          uVar13 = (((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).
                   super_ArrayBufferParent.super_ArrayObject.length;
          uVar12 = 1;
          uVar16 = uVar13 - start;
          if ((uint)start <= uVar13 && uVar16 != 0) {
            uVar12 = start + (uint)local_48;
            if (CARRY4(start,(uint)local_48)) {
              ::Math::DefaultOverflowPolicy();
            }
            goto LAB_00abf63b;
          }
        }
      }
    }
    break;
  case TypeIds_Uint8Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)local_60._1_7_ << 8);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_04.value = _intValue;
    fn_04.result = (uchar **)uStack_78;
    fn_04.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_04);
    uVar12 = 0;
    if (IVar9 < 2) {
      obj_02 = VarTo<Js::TypedArray<unsigned_char,false,false>>(local_38);
      local_38 = (long *)CONCAT71(local_38._1_7_,(undefined1)local_60);
      BVar11 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_char,false,false>>(obj_02);
      uVar12 = 0;
      if (BVar11 == 0) {
        if (((obj_02->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
            true) {
          JavascriptError::ThrowTypeError
                    ((((((obj_02->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                         super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                      ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
        }
        if (start < 0) {
          if ((long)((long)start + (local_48 & 0xffffffff)) < 0) goto LAB_00abf8ec;
          local_48 = (ulong)(uint)((int)local_48 + start);
          start = 0;
        }
        uVar13 = (obj_02->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
        uVar12 = 1;
        uVar16 = uVar13 - start;
        if ((uint)start <= uVar13 && uVar16 != 0) {
          uVar12 = start + (uint)local_48;
          if (CARRY4(start,(uint)local_48)) {
            ::Math::DefaultOverflowPolicy();
          }
LAB_00abf63b:
          __n = local_48 & 0xffffffff;
          if (uVar13 < uVar12) {
            __n = (size_t)uVar16;
          }
          puVar18 = (((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).buffer +
                    (uint)start;
          uVar12 = (uint)(byte)local_38;
LAB_00abf8e7:
          memset(puVar18,uVar12,__n);
          goto LAB_00abf8ec;
        }
      }
    }
    break;
  case TypeIds_Uint8ClampedArray:
    pTVar20 = scriptContext->threadContext;
    DVar1 = pTVar20->disableImplicitFlags;
    IVar9 = pTVar20->implicitCallFlags;
    pTVar20->disableImplicitFlags = DVar1 | DisableImplicitCallFlag;
    pTVar20->implicitCallFlags = ImplicitCall_None;
    uVar8 = JavascriptConversion::ToUInt8Clamped(local_50,scriptContext);
    local_50 = (Var)CONCAT71(local_50._1_7_,uVar8);
    IVar2 = pTVar20->implicitCallFlags;
    pTVar20->disableImplicitFlags = DVar1;
    pTVar20->implicitCallFlags = IVar9;
    uVar13 = 0;
    uVar12 = 0;
    if (IVar2 < 2) {
      obj = VarTo<Js::TypedArray<unsigned_char,true,false>>(local_38);
      BVar11 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_char,true,false>>(obj);
      uVar12 = 0;
      if (BVar11 == 0) {
        if (((obj->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
            true) {
          JavascriptError::ThrowTypeError
                    ((((((obj->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                         super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                      ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
        }
        uVar16 = (uint)local_48;
        if (start < 0) {
          if (-1 < (long)((long)start + (local_48 & 0xffffffff))) {
            uVar16 = uVar16 + start;
            start = 0;
            goto LAB_00abf196;
          }
        }
        else {
LAB_00abf196:
          uVar3 = (obj->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
          uVar12 = 1;
          if (uVar3 < (uint)start || uVar3 - start == 0) goto LAB_00abf1c8;
          if (CARRY4(start,uVar16)) {
            ::Math::DefaultOverflowPolicy();
          }
          if (uVar3 < start + uVar16) {
            uVar16 = uVar3 - start;
          }
          memset((obj->super_TypedArrayBase).buffer + (uint)start,(uint)(byte)local_50,(ulong)uVar16
                );
        }
        uVar12 = 1;
      }
    }
LAB_00abf1c8:
    pTVar20 = _typedValue;
    if (ImplicitCall_None < IVar2) goto LAB_00abf8be;
    goto LAB_00abf75b;
  case TypeIds_Int16Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)uVar6 << 0x10);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_01.value = _intValue;
    fn_01.result = (short **)uStack_78;
    fn_01.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_01);
    uVar12 = 0;
    if (IVar9 < 2) {
      obj_00 = VarTo<Js::TypedArray<short,false,false>>(local_38);
      local_38 = (long *)CONCAT62(local_38._2_6_,(undefined2)local_60);
      BVar11 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<short,false,false>>(obj_00);
      uVar12 = 0;
      if (BVar11 == 0) {
        if (((obj_00->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
            true) {
          JavascriptError::ThrowTypeError
                    ((((((obj_00->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                         super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                      ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
        }
        if (start < 0) {
          if ((long)((long)start + (local_48 & 0xffffffff)) < 0) goto LAB_00abf8ec;
          local_48 = (ulong)(uint)((int)local_48 + start);
          pvVar17 = (Var)0x0;
        }
        uVar13 = (obj_00->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
        uVar12 = 1;
        uVar16 = (uint)pvVar17;
        if (uVar16 <= uVar13 && uVar13 - uVar16 != 0) {
          if (CARRY4(uVar16,(uint)local_48)) {
            ::Math::DefaultOverflowPolicy();
          }
          uVar19 = local_48 & 0xffffffff;
          if (uVar13 < uVar16 + (uint)local_48) {
            uVar19 = (ulong)(uVar13 - uVar16);
          }
          puVar18 = (obj_00->super_TypedArrayBase).buffer;
          if ((short)local_38 == 0) {
LAB_00abf8da:
            __n = uVar19 * 2;
            puVar18 = puVar18 + (long)pvVar17 * 2;
            uVar12 = 0;
            goto LAB_00abf8e7;
          }
          if ((int)uVar19 != 0) {
            do {
              *(short *)(puVar18 + (long)pvVar17 * 2) = (short)local_38;
              pvVar17 = (Var)(ulong)((int)pvVar17 + 1);
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
      }
    }
    break;
  case TypeIds_Uint16Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)uVar6 << 0x10);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_02.value = _intValue;
    fn_02.result = (unsigned_short **)uStack_78;
    fn_02.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_02);
    uVar12 = 0;
    if (IVar9 < 2) {
      obj_01 = VarTo<Js::TypedArray<unsigned_short,false,false>>(local_38);
      local_38 = (long *)CONCAT62(local_38._2_6_,(undefined2)local_60);
      BVar11 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_short,false,false>>(obj_01)
      ;
      uVar12 = 0;
      if (BVar11 == 0) {
        if (((obj_01->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
            true) {
          JavascriptError::ThrowTypeError
                    ((((((obj_01->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                         super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                      ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
        }
        if (start < 0) {
          if ((long)((long)start + (local_48 & 0xffffffff)) < 0) goto LAB_00abf8ec;
          local_48 = (ulong)(uint)((int)local_48 + start);
          pvVar17 = (Var)0x0;
        }
        uVar13 = (obj_01->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
        uVar12 = 1;
        uVar16 = (uint)pvVar17;
        if (uVar16 <= uVar13 && uVar13 - uVar16 != 0) {
          if (CARRY4(uVar16,(uint)local_48)) {
            ::Math::DefaultOverflowPolicy();
          }
          uVar19 = local_48 & 0xffffffff;
          if (uVar13 < uVar16 + (uint)local_48) {
            uVar19 = (ulong)(uVar13 - uVar16);
          }
          puVar18 = (obj_01->super_TypedArrayBase).buffer;
          if ((short)local_38 == 0) goto LAB_00abf8da;
          if ((int)uVar19 != 0) {
            do {
              *(short *)(puVar18 + (long)pvVar17 * 2) = (short)local_38;
              pvVar17 = (Var)(ulong)((int)pvVar17 + 1);
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
      }
    }
    break;
  case TypeIds_Int32Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)uVar12 << 0x20);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_06.value = _intValue;
    fn_06.result = (int **)uStack_78;
    fn_06.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_06);
    uVar12 = 0;
    if (IVar9 < 2) {
      this_03 = VarTo<Js::TypedArray<int,false,false>>(local_38);
      uVar12 = TypedArray<int,_false,_false>::DirectSetItemAtRange
                         (this_03,start,(uint32)local_48,(int)(float)local_60);
    }
    break;
  case TypeIds_Uint32Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)uVar12 << 0x20);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_05.value = _intValue;
    fn_05.result = (uint **)uStack_78;
    fn_05.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_05);
    uVar12 = 0;
    if (IVar9 < 2) {
      this_02 = VarTo<Js::TypedArray<unsigned_int,false,false>>(local_38);
      uVar12 = TypedArray<unsigned_int,_false,_false>::DirectSetItemAtRange
                         (this_02,start,(uint32)local_48,(uint)(float)local_60);
    }
    break;
  case TypeIds_Float32Array:
    local_80 = &local_60;
    local_60 = (double)((ulong)uVar12 << 0x20);
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn.value = _intValue;
    fn.result = (float **)uStack_78;
    fn.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn);
    uVar12 = 0;
    if (IVar9 < 2) {
      this_00 = VarTo<Js::TypedArray<float,false,false>>(local_38);
      uVar12 = TypedArray<float,_false,_false>::DirectSetItemAtRange
                         (this_00,start,(uint32)local_48,(float)local_60);
    }
    break;
  case TypeIds_Float64Array:
    local_80 = &local_60;
    local_60 = 0.0;
    _intValue = &local_90;
    local_90 = local_50;
    local_68 = &local_88;
    uStack_78 = &local_80;
    fn_00.value = _intValue;
    fn_00.result = (double **)uStack_78;
    fn_00.scriptContext = local_68;
    IVar9 = ThreadContext::
            TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                      (scriptContext->threadContext,fn_00);
    uVar12 = 0;
    if (IVar9 < 2) {
      this_01 = VarTo<Js::TypedArray<double,false,false>>(local_38);
      uVar12 = TypedArray<double,_false,_false>::DirectSetItemAtRange
                         (this_01,start,(uint32)local_48,local_60);
    }
  }
  uVar13 = 0;
  _typedValue = pTVar20;
  if (IVar9 < 2) {
LAB_00abf75b:
    _typedValue = pTVar20;
    uVar13 = uVar12;
  }
LAB_00abf8be:
  _typedValue->noJsReentrancy = local_39;
  return uVar13;
}

Assistant:

BOOL JavascriptOperators::OP_Memset(Var instance, int32 start, Var value, int32 length, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_Memset, reentrancylock, scriptContext->GetThreadContext());
        if (length <= 0)
        {
            return false;
        }

        TypeId instanceType = JavascriptOperators::GetTypeId(instance);
        BOOL  returnValue = false;

        // The typed array will deal with all possible values for the index
#define MEMSET_TYPED_ARRAY_CASE(type, conversion) \
        case TypeIds_##type: \
        { \
            type## ::TypedArrayType typedValue = 0; \
            if (!MemsetConversion<type## ::TypedArrayType, JavascriptConversion:: ##conversion>(value, scriptContext, &typedValue)) return false; \
            returnValue = VarTo< type## >(instance)->DirectSetItemAtRange(start, length, typedValue); \
            break; \
        }
        switch (instanceType)
        {
        MEMSET_TYPED_ARRAY_CASE(Int8Array, ToInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8Array, ToUInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8ClampedArray, ToUInt8Clamped)
        MEMSET_TYPED_ARRAY_CASE(Int16Array, ToInt16)
        MEMSET_TYPED_ARRAY_CASE(Uint16Array, ToUInt16)
        MEMSET_TYPED_ARRAY_CASE(Int32Array, ToInt32)
        MEMSET_TYPED_ARRAY_CASE(Uint32Array, ToUInt32)
        MEMSET_TYPED_ARRAY_CASE(Float32Array, ToFloat)
        MEMSET_TYPED_ARRAY_CASE(Float64Array, ToNumber)
        case TypeIds_NativeFloatArray:
        case TypeIds_NativeIntArray:
        case TypeIds_Array:
        {
            if (start < 0)
            {
                for (start; start < 0 && length > 0; ++start, --length)
                {
                    if (!OP_SetElementI(instance, JavascriptNumber::ToVar(start, scriptContext), value, scriptContext))
                    {
                        return false;
                    }
                }
            }
            if (scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                INT_PTR vt = VirtualTableInfoBase::GetVirtualTable(instance);
                if (instanceType == TypeIds_Array)
                {
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<Var>(start, length, value);
                }
                else if (instanceType == TypeIds_NativeIntArray)
                {
                    // Only accept tagged int.
                    if (!TaggedInt::Is(value))
                    {
                        return false;
                    }
                    int32 intValue = 0;
                    if (!MemsetConversion<int32, JavascriptConversion::ToInt32>(value, scriptContext, &intValue))
                    {
                        return false;
                    }
                     // Special case for missing item
                    if (SparseArraySegment<int32>::IsMissingItem(&intValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<int32>(start, length, intValue);
                }
                else
                {
                    // For native float arrays, the jit doesn't check the type of the source so we have to do it here
                    if (!JavascriptNumber::Is(value) && !TaggedNumber::Is(value))
                    {
                        return false;
                    }

                    double doubleValue = 0;
                    if (!MemsetConversion<double, JavascriptConversion::ToNumber>(value, scriptContext, &doubleValue))
                    {
                        return false;
                    }
                    // Special case for missing item
                    if (SparseArraySegment<double>::IsMissingItem(&doubleValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<double>(start, length, doubleValue);
                }
                returnValue &= vt == VirtualTableInfoBase::GetVirtualTable(instance);
            }
            break;
        }
        default:
            AssertMsg(false, "We don't support this type for memset yet.");
            break;
        }

#undef MEMSET_TYPED_ARRAY
        return returnValue;
        JIT_HELPER_END(Op_Memset);
    }